

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O0

bool __thiscall
wasm::anon_unknown_166::HeapStoreOptimization::optimizeSubsequentStructSet
          (HeapStoreOptimization *this,StructNew *new_,StructSet *set,LocalSet *localSet)

{
  uint uVar1;
  bool bVar2;
  Index *this_00;
  size_type sVar3;
  size_t sVar4;
  Expression **ppEVar5;
  Module *wasm;
  Struct *this_01;
  Expression *pEVar6;
  Drop *left;
  Block *pBVar7;
  optional<wasm::Type> type;
  bool local_50a;
  undefined1 local_508 [12];
  EffectAnalyzer local_4f8;
  Literal local_398;
  uintptr_t local_380;
  undefined1 local_378 [8];
  Literal zero;
  Field *field;
  const_iterator __end3;
  const_iterator __begin3;
  FieldList *__range3;
  Struct *local_338;
  FieldList *fields;
  Builder builder;
  EffectAnalyzer operandEffects;
  Index i;
  undefined1 local_1b0 [8];
  EffectAnalyzer setValueEffects;
  Index refLocalIndex;
  ExpressionList *operands;
  BasicType local_38;
  Index index;
  LocalSet *local_30;
  LocalSet *localSet_local;
  StructSet *set_local;
  StructNew *new__local;
  HeapStoreOptimization *this_local;
  
  index = 1;
  local_30 = localSet;
  localSet_local = (LocalSet *)set;
  set_local = (StructSet *)new_;
  new__local = (StructNew *)this;
  bVar2 = wasm::Type::operator==
                    (&(new_->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.
                      type,&index);
  local_50a = true;
  if (!bVar2) {
    local_38 = unreachable;
    local_50a = wasm::Type::operator==
                          (&(localSet_local->super_SpecificExpression<(wasm::Expression::Id)9>).
                            super_Expression.type,&local_38);
  }
  if (local_50a == false) {
    uVar1 = localSet_local->index;
    this_00 = &set_local->index;
    setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         local_30->index;
    effects((EffectAnalyzer *)local_1b0,this,
            *(Expression **)
             &localSet_local[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression);
    sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &setValueEffects.features,
                       (key_type *)
                       ((long)&setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count + 4));
    if ((sVar3 == 0) &&
       (sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (key_type *)
                      ((long)&setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count + 4)), sVar3 == 0)) {
      bVar2 = StructNew::isWithDefault((StructNew *)set_local);
      operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = uVar1;
      if (bVar2) {
LAB_01d4a578:
        bVar2 = canSkipLocalSet(this,(StructSet *)localSet_local,(EffectAnalyzer *)local_1b0,
                                local_30);
        if (bVar2) {
          this_local._7_1_ = 0;
        }
        else {
          wasm = Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                 ::getModule((Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                                 ).
                                 super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                            );
          Builder::Builder((Builder *)&fields,wasm);
          bVar2 = StructNew::isWithDefault((StructNew *)set_local);
          if (bVar2) {
            __range3 = (FieldList *)
                       wasm::Type::getHeapType
                                 (&(set_local->super_SpecificExpression<(wasm::Expression::Id)67>).
                                   super_Expression.type);
            this_01 = HeapType::getStruct((HeapType *)&__range3);
            local_338 = this_01;
            __end3 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin(&this_01->fields)
            ;
            field = (Field *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end
                                       (&this_01->fields);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                                               *)&field), bVar2) {
              zero.type.id = (uintptr_t)
                             __gnu_cxx::
                             __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                             ::operator*(&__end3);
              local_380 = (((reference)zero.type.id)->type).id;
              wasm::Literal::makeZero((Literal *)local_378,(Type)local_380);
              wasm::Literal::Literal(&local_398,(Literal *)local_378);
              pEVar6 = Builder::makeConstantExpression((Builder *)&fields,&local_398);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         this_00,pEVar6);
              wasm::Literal::~Literal(&local_398);
              wasm::Literal::~Literal((Literal *)local_378);
              __gnu_cxx::
              __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
              ::operator++(&__end3);
            }
          }
          ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)this_00,(ulong)uVar1);
          effects(&local_4f8,this,*ppEVar5);
          bVar2 = EffectAnalyzer::hasUnremovableSideEffects(&local_4f8);
          EffectAnalyzer::~EffectAnalyzer(&local_4f8);
          if (bVar2) {
            ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)this_00,(ulong)uVar1);
            left = Builder::makeDrop((Builder *)&fields,*ppEVar5);
            pEVar6 = *(Expression **)
                      &localSet_local[1].super_SpecificExpression<(wasm::Expression::Id)9>.
                       super_Expression;
            std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_508);
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._12_4_ = 0;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)local_508._0_8_;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_508[8];
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._9_3_ = local_508._9_3_;
            pBVar7 = Builder::makeSequence((Builder *)&fields,(Expression *)left,pEVar6,type);
            ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)this_00,(ulong)uVar1);
            *ppEVar5 = (Expression *)pBVar7;
          }
          else {
            pEVar6 = *(Expression **)
                      &localSet_local[1].super_SpecificExpression<(wasm::Expression::Id)9>.
                       super_Expression;
            ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)this_00,(ulong)uVar1);
            *ppEVar5 = pEVar6;
          }
          this_local._7_1_ = 1;
        }
      }
      else {
        do {
          operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
               operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
               + 1;
          sVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )this_00);
          if (sVar4 <= operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count._4_4_) goto LAB_01d4a578;
          ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)this_00,
                               (ulong)operandEffects.delegateTargets._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count._4_4_);
          effects((EffectAnalyzer *)&builder,this,*ppEVar5);
          bVar2 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)&builder,(EffectAnalyzer *)local_1b0);
          if (bVar2) {
            this_local._7_1_ = 0;
          }
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&builder);
        } while (!bVar2);
      }
    }
    else {
      this_local._7_1_ = 0;
    }
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1b0);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool optimizeSubsequentStructSet(StructNew* new_,
                                   StructSet* set,
                                   LocalSet* localSet) {
    // Leave unreachable code for DCE, to avoid updating types here.
    if (new_->type == Type::unreachable || set->type == Type::unreachable) {
      return false;
    }

    auto index = set->index;
    auto& operands = new_->operands;
    auto refLocalIndex = localSet->index;

    // Check for effects that prevent us moving the struct.set's value (X' in
    // the function comment) into its new position in the struct.new. First, it
    // must be ok to move it past the local.set (otherwise, it might read from
    // memory using that local, and depend on the struct.new having already
    // occurred; or, if it writes to that local, then it would cross another
    // write).
    auto setValueEffects = effects(set->value);
    if (setValueEffects.localsRead.count(refLocalIndex) ||
        setValueEffects.localsWritten.count(refLocalIndex)) {
      return false;
    }

    // We must move the set's value past indexes greater than it (Y and Z in
    // the example in the comment on this function). If this is not with_default
    // then we must check for effects.
    // TODO When this function is called repeatedly in a sequence this can
    //      become quadratic - perhaps we should memoize (though, struct sizes
    //      tend to not be ridiculously large).
    if (!new_->isWithDefault()) {
      for (Index i = index + 1; i < operands.size(); i++) {
        auto operandEffects = effects(operands[i]);
        if (operandEffects.invalidates(setValueEffects)) {
          // TODO: we could use locals to reorder everything
          return false;
        }
      }
    }

    // We must also be careful of branches out from the value that skip the
    // local.set, see below.
    if (canSkipLocalSet(set, setValueEffects, localSet)) {
      return false;
    }

    // We can optimize here!
    Builder builder(*getModule());

    // If this was with_default then we add default values now. That does
    // increase code size in some cases (if there are many values, and few sets
    // that get removed), but in general this optimization is worth it.
    if (new_->isWithDefault()) {
      auto& fields = new_->type.getHeapType().getStruct().fields;
      for (auto& field : fields) {
        auto zero = Literal::makeZero(field.type);
        operands.push_back(builder.makeConstantExpression(zero));
      }
    }

    // See if we need to keep the old value.
    if (effects(operands[index]).hasUnremovableSideEffects()) {
      operands[index] =
        builder.makeSequence(builder.makeDrop(operands[index]), set->value);
    } else {
      operands[index] = set->value;
    }

    return true;
  }